

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

ExternFuncInfo * nullcFindModuleFunction(char *module,char *name,int index)

{
  int iVar1;
  uint uVar2;
  ByteCode *code_00;
  uint local_70;
  uint i;
  uint end;
  ExternFuncInfo *fInfo;
  ByteCode *code;
  uint hash;
  char *bytecode;
  TraceScope traceScope;
  int local_24;
  int index_local;
  char *name_local;
  char *module_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    module_local = (char *)0x0;
  }
  else {
    if ((nullcFindModuleFunction(char_const*,char_const*,int)::token == '\0') &&
       (iVar1 = __cxa_guard_acquire(&nullcFindModuleFunction(char_const*,char_const*,int)::token),
       iVar1 != 0)) {
      nullcFindModuleFunction::token = NULLC::TraceGetToken("nullc","nullcFindModuleFunction");
      __cxa_guard_release(&nullcFindModuleFunction(char_const*,char_const*,int)::token);
    }
    NULLC::TraceScope::TraceScope((TraceScope *)&bytecode,nullcFindModuleFunction::token);
    NULLC::TraceLabel(module);
    code_00 = (ByteCode *)BinaryCache::FindBytecode(module,true);
    if (code_00 == (ByteCode *)0x0) {
      NULLC::nullcLastError = "ERROR: failed to find module";
      module_local = (char *)0x0;
    }
    else {
      uVar2 = NULLC::GetStringHash(name);
      _i = FindFirstFunc(code_00);
      local_24 = index;
      for (local_70 = 0; local_70 < code_00->functionCount - code_00->moduleFunctionCount;
          local_70 = local_70 + 1) {
        if (uVar2 == _i->nameHash) {
          if (local_24 == 0) {
            module_local = (char *)_i;
            goto LAB_0010bda8;
          }
          local_24 = local_24 + -1;
        }
        _i = _i + 1;
      }
      NULLC::SafeSprintf(NULLC::errorBuf,0x10000,
                         "ERROR: function \'%s\' or one of it\'s overload is not found in module \'%s\'"
                         ,name,module);
      NULLC::nullcLastError = NULLC::errorBuf;
      module_local = (char *)0x0;
    }
LAB_0010bda8:
    NULLC::TraceScope::~TraceScope((TraceScope *)&bytecode);
  }
  return (ExternFuncInfo *)module_local;
}

Assistant:

ExternFuncInfo* nullcFindModuleFunction(const char* module, const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(NULL);

	TRACE_SCOPE("nullc", "nullcFindModuleFunction");
	TRACE_LABEL(module);

	const char *bytecode = BinaryCache::FindBytecode(module, true);

	// Create module if not found
	if(!bytecode)
	{
		nullcLastError = "ERROR: failed to find module";
		return NULL;
	}

	unsigned hash = NULLC::GetStringHash(name);
	ByteCode *code = (ByteCode*)bytecode;

	// Find function and set pointer
	ExternFuncInfo *fInfo = FindFirstFunc(code);

	unsigned end = code->functionCount - code->moduleFunctionCount;

	for(unsigned i = 0; i < end; i++, fInfo++)
	{
		if(hash != fInfo->nameHash)
			continue;

		if(index == 0)
			return fInfo;

		index--;
	}

	NULLC::SafeSprintf(errorBuf, NULLC_ERROR_BUFFER_SIZE, "ERROR: function '%s' or one of it's overload is not found in module '%s'", name, module);

	nullcLastError = errorBuf;
	return NULL;
}